

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

void __thiscall
tinyusdz::PrimMetas::update_from(PrimMetas *this,PrimMetas *rhs,bool override_authored)

{
  _Rb_tree_header *p_Var1;
  const_iterator cVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  
  if (((rhs->active).has_value_ == true) &&
     ((override_authored || ((this->active).has_value_ == false)))) {
    if ((this->active).has_value_ == false) {
      (this->active).contained = (rhs->active).contained;
      (this->active).has_value_ = true;
    }
    else {
      (this->active).contained = (rhs->active).contained;
    }
  }
  if (((rhs->hidden).has_value_ == true) &&
     ((override_authored || ((this->hidden).has_value_ == false)))) {
    if ((this->hidden).has_value_ == false) {
      (this->hidden).contained = (rhs->hidden).contained;
      (this->hidden).has_value_ = true;
    }
    else {
      (this->hidden).contained = (rhs->hidden).contained;
    }
  }
  if (((rhs->kind).has_value_ == true) &&
     ((override_authored || ((this->kind).has_value_ == false)))) {
    if ((this->kind).has_value_ == false) {
      (this->kind).contained = (rhs->kind).contained;
      (this->kind).has_value_ = true;
    }
    else {
      (this->kind).contained = (rhs->kind).contained;
    }
  }
  if (((rhs->instanceable).has_value_ == true) &&
     ((override_authored || ((this->instanceable).has_value_ == false)))) {
    if ((this->instanceable).has_value_ == false) {
      (this->instanceable).contained = (rhs->instanceable).contained;
      (this->instanceable).has_value_ = true;
    }
    else {
      (this->instanceable).contained = (rhs->instanceable).contained;
    }
  }
  if ((rhs->assetInfo).has_value_ == true) {
    if ((this->assetInfo).has_value_ == true) {
      anon_unknown_240::OverrideCustomDataRec
                (0,(CustomDataType *)&(this->assetInfo).contained,
                 (CustomDataType *)&(rhs->assetInfo).contained,override_authored);
    }
    else if (override_authored) {
      nonstd::optional_lite::
      optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
      ::operator=(&this->assetInfo,&rhs->assetInfo);
    }
  }
  if ((rhs->clips).has_value_ == true) {
    if ((this->clips).has_value_ == true) {
      anon_unknown_240::OverrideCustomDataRec
                (0,(CustomDataType *)&(this->clips).contained,
                 (CustomDataType *)&(rhs->clips).contained,override_authored);
    }
    else if (override_authored) {
      nonstd::optional_lite::
      optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
      ::operator=(&this->clips,&rhs->clips);
    }
  }
  if ((rhs->customData).has_value_ == true) {
    if ((this->customData).has_value_ == true) {
      anon_unknown_240::OverrideCustomDataRec
                (0,(CustomDataType *)&(this->customData).contained,
                 (CustomDataType *)&(rhs->customData).contained,override_authored);
    }
    else if (override_authored) {
      nonstd::optional_lite::
      optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
      ::operator=(&this->customData,&rhs->customData);
    }
  }
  if (((rhs->doc).has_value_ == true) && ((override_authored || ((this->doc).has_value_ == false))))
  {
    nonstd::optional_lite::optional<tinyusdz::value::StringData>::operator=(&this->doc,&rhs->doc);
  }
  if (((rhs->comment).has_value_ == true) &&
     ((override_authored || ((this->comment).has_value_ == false)))) {
    nonstd::optional_lite::optional<tinyusdz::value::StringData>::operator=
              (&this->comment,&rhs->comment);
  }
  if (((rhs->apiSchemas).has_value_ == true) &&
     ((override_authored || ((this->apiSchemas).has_value_ == false)))) {
    nonstd::optional_lite::optional<tinyusdz::APISchemas>::operator=
              (&this->apiSchemas,&rhs->apiSchemas);
  }
  if ((rhs->sdrMetadata).has_value_ == true) {
    if ((this->sdrMetadata).has_value_ == true) {
      anon_unknown_240::OverrideCustomDataRec
                (0,(CustomDataType *)&(this->sdrMetadata).contained,
                 (CustomDataType *)&(rhs->sdrMetadata).contained,override_authored);
    }
    else if (override_authored) {
      nonstd::optional_lite::
      optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
      ::operator=(&this->sdrMetadata,&rhs->sdrMetadata);
    }
  }
  if (((rhs->sceneName).has_value_ == true) &&
     ((override_authored || ((this->sceneName).has_value_ == false)))) {
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&this->sceneName,&rhs->sceneName);
  }
  if (((rhs->displayName).has_value_ == true) &&
     ((override_authored || ((this->displayName).has_value_ == false)))) {
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&this->displayName,&rhs->displayName);
  }
  if (((rhs->references).has_value_ == true) &&
     ((override_authored || ((this->references).has_value_ == false)))) {
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>_>
    ::operator=(&this->references,&rhs->references);
  }
  if (((rhs->payload).has_value_ == true) &&
     ((override_authored || ((this->payload).has_value_ == false)))) {
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>_>_>
    ::operator=(&this->payload,&rhs->payload);
  }
  if (((rhs->inherits).has_value_ == true) &&
     ((override_authored || ((this->inherits).has_value_ == false)))) {
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
    ::operator=(&this->inherits,&rhs->inherits);
  }
  if (((rhs->variantSets).has_value_ == true) &&
     ((override_authored || ((this->variantSets).has_value_ == false)))) {
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator=(&this->variantSets,&rhs->variantSets);
  }
  if (((rhs->variants).has_value_ == true) &&
     ((override_authored || ((this->variants).has_value_ == false)))) {
    nonstd::optional_lite::
    optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator=(&this->variants,&rhs->variants);
  }
  if (((rhs->specializes).has_value_ == true) &&
     ((override_authored || ((this->specializes).has_value_ == false)))) {
    nonstd::optional_lite::
    optional<std::pair<tinyusdz::ListEditQual,_std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>_>_>
    ::operator=(&this->specializes,&rhs->specializes);
  }
  if ((rhs->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var4 = (rhs->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(rhs->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      do {
        cVar2 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&this->unregisteredMetas,(key_type *)(p_Var4 + 1));
        if (override_authored ||
            (_Rb_tree_header *)cVar2._M_node ==
            &(this->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header) {
          pmVar3 = ::std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&this->unregisteredMetas,(key_type *)(p_Var4 + 1));
          ::std::__cxx11::string::_M_assign((string *)pmVar3);
        }
        p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
  }
  anon_unknown_240::OverrideCustomDataRec(0,&this->meta,&rhs->meta,override_authored);
  return;
}

Assistant:

void PrimMetas::update_from(const PrimMetas &rhs, const bool override_authored) {
  if (rhs.active.has_value()) {
    if (override_authored || !active.has_value()) {
      active = rhs.active;
    }
  }

  if (rhs.hidden.has_value()) {
    if (override_authored || !hidden.has_value()) {
      hidden = rhs.hidden;
    }
  }

  if (rhs.kind.has_value()) {
    if (override_authored || !kind.has_value()) {
      kind = rhs.kind;
    }
  }

  if (rhs.instanceable.has_value()) {
    if (override_authored || !instanceable.has_value()) {
      instanceable = rhs.instanceable;
    }
  }

  if (rhs.assetInfo) {
    if (assetInfo) {
      OverrideDictionary(assetInfo.value(), rhs.assetInfo.value(), override_authored);
    } else if (override_authored) {
      assetInfo = rhs.assetInfo;
    }
  }

  if (rhs.clips) {
    if (clips) {
      OverrideDictionary(clips.value(), rhs.clips.value(), override_authored);
    } else if (override_authored) {
      clips = rhs.clips;
    }
  }

  if (rhs.customData) {
    if (customData) {
      OverrideDictionary(customData.value(), rhs.customData.value(), override_authored);
    } else if (override_authored) {
      customData = rhs.customData;
    }
  }

  if (rhs.doc) {
    if (override_authored || !doc.has_value()) {
      doc = rhs.doc;
    }
  }

  if (rhs.comment) {
    if (override_authored || !comment.has_value()) {
      comment = rhs.comment;
    }
  }

  if (rhs.apiSchemas) {
    if (override_authored || !apiSchemas.has_value()) {
      apiSchemas = rhs.apiSchemas;
    }
  }

  if (rhs.sdrMetadata) {
    if (sdrMetadata) {
      OverrideDictionary(sdrMetadata.value(), rhs.sdrMetadata.value(), override_authored);
    } else if (override_authored) {
      sdrMetadata = rhs.sdrMetadata;
    }
  }

  if (rhs.sceneName) {
    if (override_authored || !sceneName.has_value()) {
      sceneName = rhs.sceneName;
    }
  }

  if (rhs.displayName) {
    if (override_authored || !displayName.has_value()) {
      displayName = rhs.displayName;
    }
  }

  if (rhs.references) {
    if (override_authored || !references.has_value()) {
      references = rhs.references;
    }
  }
  if (rhs.payload) {
    if (override_authored || !payload.has_value()) {
      payload = rhs.payload;
    }
  }
  if (rhs.inherits) {
    if (override_authored || !inherits.has_value()) {
      inherits = rhs.inherits;
    }
  }
  if (rhs.variantSets) {
    if (override_authored || !variantSets.has_value()) {
      variantSets = rhs.variantSets;
    }
  }
  if (rhs.variants) {
    if (override_authored || !variants.has_value()) {
      variants = rhs.variants;
    }
  }
  if (rhs.specializes) {
    if (override_authored || !specializes.has_value()) {
      specializes = rhs.specializes;
    }
  }

  if (rhs.unregisteredMetas.size()) {
    for (const auto &item : rhs.unregisteredMetas) {
      if (unregisteredMetas.count(item.first)) {
        if (override_authored) {
          unregisteredMetas[item.first] = item.second;
        } 
      } else {
        unregisteredMetas[item.first] = item.second;
      }
    }
  }

  OverrideDictionary(meta, rhs.meta, override_authored);
}